

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-death-test.cc
# Opt level: O2

TestRole __thiscall testing::internal::ExecDeathTest::AssumeRole(ExecDeathTest *this)

{
  TestInfo *pTVar1;
  InternalRunDeathTestFlag *pIVar2;
  ExecDeathTest *pEVar3;
  int iVar4;
  int iVar5;
  UnitTestImpl *pUVar6;
  int *piVar7;
  void *__addr;
  char *pcVar8;
  size_t __len;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar9;
  sigaction *psVar10;
  long lVar11;
  allocator local_315;
  int pipe_fd [2];
  int death_test_index;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_308;
  bool result;
  int dummy;
  ExecDeathTest *local_2a8;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_2a0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_280;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_260;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_240;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_220;
  string local_200;
  Arguments args;
  ExecDeathTestArgs args_2;
  string internal_flag;
  string filter_flag;
  sigaction ignore_sigprof_action;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args_1;
  
  pUVar6 = GetUnitTestImpl();
  pTVar1 = pUVar6->current_test_info_;
  pIVar2 = (pUVar6->internal_run_death_test_flag_)._M_t.
           super___uniq_ptr_impl<testing::internal::InternalRunDeathTestFlag,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           ._M_t.
           super__Tuple_impl<0UL,_testing::internal::InternalRunDeathTestFlag_*,_std::default_delete<testing::internal::InternalRunDeathTestFlag>_>
           .super__Head_base<0UL,_testing::internal::InternalRunDeathTestFlag_*,_false>._M_head_impl
  ;
  death_test_index = (pTVar1->result_).death_test_count_;
  if (pIVar2 != (InternalRunDeathTestFlag *)0x0) {
    (this->super_ForkingDeathTest).super_DeathTestImpl.write_fd_ = pIVar2->write_fd_;
    return EXECUTE_TEST;
  }
  iVar4 = pipe(pipe_fd);
  if (iVar4 == -1) {
    std::__cxx11::string::string((string *)&local_308,"CHECK failed: File ",(allocator *)&local_260)
    ;
    std::operator+(&local_280,&local_308,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_280,", line ");
    local_240._M_dataplus._M_p._0_4_ = 0x592;
    StreamableToString<int>(&local_2a0,(int *)&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,": ")
    ;
    pcVar8 = "pipe(pipe_fd) != -1";
LAB_0012a037:
    psVar10 = &ignore_sigprof_action;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1;
LAB_0012a320:
    std::operator+(pbVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                          psVar10,pcVar8);
    DeathTestAbort(pbVar9);
  }
  local_2a8 = this;
  iVar4 = fcntl(pipe_fd[1],2,0);
  if (iVar4 == -1) {
    std::__cxx11::string::string((string *)&local_308,"CHECK failed: File ",(allocator *)&local_260)
    ;
    std::operator+(&local_280,&local_308,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_280,", line ");
    local_240._M_dataplus._M_p._0_4_ = 0x595;
    StreamableToString<int>(&local_2a0,(int *)&local_240);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_2a0);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   &ignore_sigprof_action,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,": ")
    ;
    pcVar8 = "fcntl(pipe_fd[1], F_SETFD, 0) != -1";
    goto LAB_0012a037;
  }
  std::__cxx11::string::string((string *)&local_308,"--",(allocator *)&local_2a0);
  std::operator+(&local_280,&local_308,"gtest_");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_280,"filter");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,"=");
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 (pTVar1->test_suite_name_)._M_dataplus._M_p);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,".");
  std::operator+(&filter_flag,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                 (pTVar1->name_)._M_dataplus._M_p);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::string((string *)&local_220,"--",&local_315);
  std::operator+(&local_260,&local_220,"gtest_");
  std::operator+(&local_240,&local_260,"internal_run_death_test");
  std::operator+(&local_2a0,&local_240,"=");
  pEVar3 = local_2a8;
  std::operator+(&local_308,&local_2a0,local_2a8->file_);
  std::operator+(&local_280,&local_308,"|");
  StreamableToString<int>((string *)&args,&pEVar3->line_);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_280,(string *)&args);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,"|");
  StreamableToString<int>((string *)&args_2,&death_test_index);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 (string *)&args_2);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 &ignore_sigprof_action,"|");
  StreamableToString<int>(&local_200,pipe_fd + 1);
  std::operator+(&internal_flag,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1,
                 &local_200);
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  std::__cxx11::string::_M_dispose();
  Arguments::Arguments(&args);
  GetInjectableArgvs_abi_cxx11_();
  Arguments::AddArguments<std::__cxx11::string>(&args,&args_1);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&args_1);
  Arguments::AddArgument(&args,filter_flag._M_dataplus._M_p);
  Arguments::AddArgument(&args,internal_flag._M_dataplus._M_p);
  std::__cxx11::string::string((string *)&args_1,"",(allocator *)&ignore_sigprof_action);
  DeathTest::set_last_death_test_message((string *)&args_1);
  std::__cxx11::string::_M_dispose();
  CaptureStderr();
  FlushInfoLog();
  args_2.argv = args.args_.super__Vector_base<char_*,_std::allocator<char_*>_>._M_impl.
                super__Vector_impl_data._M_start;
  args_2.close_fd = pipe_fd[0];
  memset(&ignore_sigprof_action,0,0x98);
  sigemptyset((sigset_t *)&ignore_sigprof_action.sa_mask);
  ignore_sigprof_action.__sigaction_handler = (anon_union_8_2_5ad2d23e_for___sigaction_handler)0x1;
  do {
    iVar4 = sigaction(0x1b,(sigaction *)&ignore_sigprof_action,(sigaction *)&args_1);
    if (iVar4 != -1) {
      if (FLAGS_gtest_death_test_use_fork == '\0') {
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down == '\0') goto LAB_0012a0f5;
LAB_00129c47:
        iVar4 = getpagesize();
        __len = (size_t)(iVar4 * 2);
        __addr = mmap((void *)0x0,__len,3,0x22,-1,0);
        if (__addr == (void *)0xffffffffffffffff) {
          std::__cxx11::string::string
                    ((string *)&local_240,"CHECK failed: File ",(allocator *)&local_200);
          std::operator+(&local_2a0,&local_240,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_308,&local_2a0,", line ");
          local_220._M_dataplus._M_p._0_4_ = 0x55b;
          StreamableToString<int>(&local_260,(int *)&local_220);
          std::operator+(&local_280,&local_308,&local_260);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,&local_280,": ");
          pcVar8 = "stack != MAP_FAILED";
          goto LAB_0012a31b;
        }
        lVar11 = 0;
        if (ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down != '\0') {
          lVar11 = __len - 0x40;
        }
        if (((uint)(iVar4 * 2) < 0x41) || (((ulong)(lVar11 + (long)__addr) & 0x3f) != 0)) {
          std::__cxx11::string::string
                    ((string *)&local_240,"CHECK failed: File ",(allocator *)&local_200);
          std::operator+(&local_2a0,&local_240,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_308,&local_2a0,", line ");
          local_220._M_dataplus._M_p._0_4_ = 0x569;
          StreamableToString<int>(&local_260,(int *)&local_220);
          std::operator+(&local_280,&local_308,&local_260);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,&local_280,": ");
          pcVar8 = 
          "static_cast<size_t>(stack_size) > kMaxStackAlignment && reinterpret_cast<uintptr_t>(stack_top) % kMaxStackAlignment == 0"
          ;
          goto LAB_0012a31b;
        }
        iVar4 = clone(ExecDeathTestChildMain,(void *)(lVar11 + (long)__addr),0x11,&args_2);
        iVar5 = munmap(__addr,__len);
        if (iVar5 == -1) {
          std::__cxx11::string::string
                    ((string *)&local_240,"CHECK failed: File ",(allocator *)&local_200);
          std::operator+(&local_2a0,&local_240,
                         "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                        );
          std::operator+(&local_308,&local_2a0,", line ");
          local_220._M_dataplus._M_p._0_4_ = 0x56d;
          StreamableToString<int>(&local_260,(int *)&local_220);
          std::operator+(&local_280,&local_308,&local_260);
          std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         &result,&local_280,": ");
          pcVar8 = "munmap(stack, stack_size) != -1";
          goto LAB_0012a31b;
        }
      }
      else {
        iVar4 = fork();
        if (iVar4 == 0) {
          ExecDeathTestChildMain(&args_2);
LAB_0012a0f5:
          iVar4 = __cxa_guard_acquire();
          if (iVar4 != 0) {
            StackLowerThanAddress(&dummy,&result);
            ExecDeathTestSpawnChild(char_const**,int)::stack_grows_down = result;
            __cxa_guard_release();
          }
          goto LAB_00129c47;
        }
      }
      goto LAB_00129cd7;
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  std::__cxx11::string::string((string *)&local_260,"CHECK failed: File ",&local_315);
  std::operator+(&local_240,&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_2a0,&local_240,", line ");
  local_200._M_dataplus._M_p._0_4_ = 0x54f;
  StreamableToString<int>(&local_220,(int *)&local_200);
  std::operator+(&local_308,&local_2a0,&local_220);
  std::operator+(&local_280,&local_308,": ");
  pcVar8 = "sigaction( SIGPROF, &ignore_sigprof_action, &saved_sigprof_action)";
LAB_00129d95:
  psVar10 = (sigaction *)&result;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10,
                 &local_280,pcVar8);
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy;
LAB_00129e99:
  std::operator+(pbVar9,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10
                 ," != -1");
  DeathTestAbort(pbVar9);
LAB_00129cd7:
  iVar5 = sigaction(0x1b,(sigaction *)&args_1,(sigaction *)0x0);
  if (iVar5 == -1) {
    piVar7 = __errno_location();
    if (*piVar7 != 4) goto code_r0x00129cf6;
    goto LAB_00129cd7;
  }
  if (iVar4 == -1) {
    std::__cxx11::string::string((string *)&local_240,"CHECK failed: File ",(allocator *)&local_200)
    ;
    std::operator+(&local_2a0,&local_240,
                   "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                  );
    std::operator+(&local_308,&local_2a0,", line ");
    local_220._M_dataplus._M_p._0_4_ = 0x57d;
    StreamableToString<int>(&local_260,(int *)&local_220);
    std::operator+(&local_280,&local_308,&local_260);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                   &local_280,": ");
    pcVar8 = "child_pid != -1";
LAB_0012a31b:
    psVar10 = (sigaction *)&result;
    pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy;
    goto LAB_0012a320;
  }
  do {
    iVar5 = close(pipe_fd[1]);
    if (iVar5 != -1) {
      *(int *)&(local_2a8->super_ForkingDeathTest).super_DeathTestImpl.field_0x3c = iVar4;
      (local_2a8->super_ForkingDeathTest).super_DeathTestImpl.read_fd_ = pipe_fd[0];
      (local_2a8->super_ForkingDeathTest).super_DeathTestImpl.spawned_ = true;
      Arguments::~Arguments(&args);
      std::__cxx11::string::_M_dispose();
      std::__cxx11::string::_M_dispose();
      return OVERSEE_TEST;
    }
    piVar7 = __errno_location();
  } while (*piVar7 == 4);
  std::__cxx11::string::string((string *)&local_2a0,"CHECK failed: File ",(allocator *)&local_220);
  std::operator+(&local_308,&local_2a0,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_280,&local_308,", line ");
  local_260._M_dataplus._M_p._0_4_ = 0x5ac;
  StreamableToString<int>(&local_240,(int *)&local_260);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 &local_280,&local_240);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,": ");
  psVar10 = &ignore_sigprof_action;
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)psVar10,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&dummy,
                 "close(pipe_fd[1])");
  pbVar9 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&args_1;
  goto LAB_00129e99;
code_r0x00129cf6:
  std::__cxx11::string::string((string *)&local_260,"CHECK failed: File ",&local_315);
  std::operator+(&local_240,&local_260,
                 "/workspace/llm4binary/github/license_c_cmakelists/apple[P]swift-llbuild/utils/unittest/googletest/src/gtest-death-test.cc"
                );
  std::operator+(&local_2a0,&local_240,", line ");
  local_200._M_dataplus._M_p._0_4_ = 0x57a;
  StreamableToString<int>(&local_220,(int *)&local_200);
  std::operator+(&local_308,&local_2a0,&local_220);
  std::operator+(&local_280,&local_308,": ");
  pcVar8 = "sigaction(SIGPROF, &saved_sigprof_action, nullptr)";
  goto LAB_00129d95;
}

Assistant:

DeathTest::TestRole ExecDeathTest::AssumeRole() {
  const UnitTestImpl* const impl = GetUnitTestImpl();
  const InternalRunDeathTestFlag* const flag =
      impl->internal_run_death_test_flag();
  const TestInfo* const info = impl->current_test_info();
  const int death_test_index = info->result()->death_test_count();

  if (flag != nullptr) {
    set_write_fd(flag->write_fd());
    return EXECUTE_TEST;
  }

  int pipe_fd[2];
  GTEST_DEATH_TEST_CHECK_(pipe(pipe_fd) != -1);
  // Clear the close-on-exec flag on the write end of the pipe, lest
  // it be closed when the child process does an exec:
  GTEST_DEATH_TEST_CHECK_(fcntl(pipe_fd[1], F_SETFD, 0) != -1);

  const std::string filter_flag = std::string("--") + GTEST_FLAG_PREFIX_ +
                                  kFilterFlag + "=" + info->test_suite_name() +
                                  "." + info->name();
  const std::string internal_flag =
      std::string("--") + GTEST_FLAG_PREFIX_ + kInternalRunDeathTestFlag + "="
      + file_ + "|" + StreamableToString(line_) + "|"
      + StreamableToString(death_test_index) + "|"
      + StreamableToString(pipe_fd[1]);
  Arguments args;
  args.AddArguments(GetArgvsForDeathTestChildProcess());
  args.AddArgument(filter_flag.c_str());
  args.AddArgument(internal_flag.c_str());

  DeathTest::set_last_death_test_message("");

  CaptureStderr();
  // See the comment in NoExecDeathTest::AssumeRole for why the next line
  // is necessary.
  FlushInfoLog();

  const pid_t child_pid = ExecDeathTestSpawnChild(args.Argv(), pipe_fd[0]);
  GTEST_DEATH_TEST_CHECK_SYSCALL_(close(pipe_fd[1]));
  set_child_pid(child_pid);
  set_read_fd(pipe_fd[0]);
  set_spawned(true);
  return OVERSEE_TEST;
}